

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::CollationSettings::setAlternateHandling
          (CollationSettings *this,UColAttributeValue value,int32_t defaultOptions,
          UErrorCode *errorCode)

{
  uint uVar1;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  uVar1 = this->options & 0xfffffff3;
  if (value == UCOL_DEFAULT) {
    uVar1 = uVar1 | defaultOptions & 0xcU;
  }
  else if (value == UCOL_SHIFTED) {
    uVar1 = uVar1 | 4;
  }
  else if (value != UCOL_NON_IGNORABLE) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  this->options = uVar1;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }